

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O1

wheelchair_boarding_t parse_wheelchair_boarding(char *value)

{
  int iVar1;
  wheelchair_boarding_t wVar2;
  
  iVar1 = strcmp(value,"0");
  wVar2 = WB_UNKNOWN_OR_INHERITED;
  if ((iVar1 != 0) && (*value != '\0')) {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      wVar2 = WB_SOME;
    }
    else {
      iVar1 = strcmp(value,"2");
      wVar2 = WB_NOT_SET - (iVar1 == 0);
    }
  }
  return wVar2;
}

Assistant:

wheelchair_boarding_t parse_wheelchair_boarding(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return WB_UNKNOWN_OR_INHERITED;
    else if (strcmp(value, "1") == 0)
        return WB_SOME;
    else if (strcmp(value, "2") == 0)
        return WB_NOT_POSSIBLE;
    else
        return WB_NOT_SET;
}